

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O0

int __thiscall CTcSymMetaclassBase::write_to_sym_file(CTcSymMetaclassBase *this,CVmFile *fp)

{
  char *__s;
  CVmFile *this_00;
  CVmFile *in_RSI;
  CVmFile *in_RDI;
  size_t idlen;
  char *id;
  char c;
  CTcSymbolBase *in_stack_ffffffffffffffe0;
  
  CTcSymbolBase::write_to_sym_file(in_stack_ffffffffffffffe0,in_RDI);
  __s = CTcGenTarg::get_meta_name(G_cg,*(int *)&in_RDI[3].fp_);
  c = (char)((ulong)in_RDI >> 0x38);
  this_00 = (CVmFile *)strlen(__s);
  CVmFile::write_byte(this_00,c);
  CVmFile::write_bytes(in_RSI,__s,(size_t)this_00);
  return 1;
}

Assistant:

int CTcSymMetaclassBase::write_to_sym_file(class CVmFile *fp)
{
    /* inherit the base class handling to write the symbol */
    CTcSymbol::write_to_sym_file(fp);

    /* add the metaclass ID string */
    const char *id = G_cg->get_meta_name(meta_idx_);
    size_t idlen = strlen(id);
    fp->write_byte((char)idlen);
    fp->write_bytes(id, idlen);

    /* success */
    return TRUE; 
}